

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::
PlainTemplatedDefines<unsigned_int,duckdb::TemplatedParquetValueConversion<unsigned_int>,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  ulong __n;
  idx_t copy_count;
  
  __n = num_values * 4;
  if (plain_data->len < __n) {
    PlainTemplatedInternal<unsigned_int,duckdb::TemplatedParquetValueConversion<unsigned_int>,false,true>
              (this,plain_data,defines,num_values,result_offset,result);
    return;
  }
  switchD_0193dc74::default(result->data + result_offset * 4,plain_data->ptr,__n);
  plain_data->len = plain_data->len + num_values * -4;
  plain_data->ptr = plain_data->ptr + __n;
  return;
}

Assistant:

void PlainTemplatedDefines(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, idx_t result_offset,
	                           Vector &result) {
		if (CONVERSION::PlainAvailable(plain_data, num_values)) {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, false>(plain_data, defines, num_values,
			                                                                   result_offset, result);
		} else {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, true>(plain_data, defines, num_values,
			                                                                  result_offset, result);
		}
	}